

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::GLES2SharingTest::iterate(GLES2SharingTest *this)

{
  bool bVar1;
  bool bVar2;
  Visibility visibility_;
  int iVar3;
  deUint32 err;
  Library *egl_00;
  NativeDisplay *pNVar4;
  EGLDisplay pvVar5;
  NativeDisplayFactory *factory;
  CommandLine *pCVar6;
  NativeWindowFactory *pNVar7;
  EGLConfig config_00;
  NativeWindow *window_00;
  EGLDisplay display_00;
  EGLSurface pvVar8;
  MessageBuilder *pMVar9;
  EGLContext share;
  EGLContext context;
  MessageBuilder local_17a8;
  MessageBuilder local_1628;
  MessageBuilder local_14a8;
  MessageBuilder local_1328;
  MessageBuilder local_11a8;
  MessageBuilder local_1028;
  MessageBuilder local_ea8;
  MessageBuilder local_d28;
  undefined1 local_ba8 [8];
  Surface ref_1;
  Surface screen_1;
  MessageBuilder local_9f8;
  undefined1 local_878 [8];
  Surface ref;
  Surface screen;
  int height;
  int width;
  MessageBuilder local_540;
  MessageBuilder local_3c0;
  MessageBuilder local_240;
  undefined1 local_c0 [8];
  UniqueSurface surface;
  undefined1 local_98 [8];
  UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> window;
  EGLint attribList [7];
  EGLContext contextB;
  EGLContext contextA;
  bool isOk;
  EGLConfig config;
  NativeWindowFactory *windowFactory;
  UniqueDisplay display;
  TestLog *log;
  Library *egl;
  GLES2SharingTest *this_local;
  
  egl_00 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  display.m_display =
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pNVar4 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar5 = eglu::getAndInitDisplay(pNVar4,(Version *)0x0);
  eglu::UniqueDisplay::UniqueDisplay((UniqueDisplay *)&windowFactory,egl_00,pvVar5);
  factory = EglTestContext::getNativeDisplayFactory((this->super_TestCase).m_eglTestCtx);
  pCVar6 = tcu::TestContext::getCommandLine
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pNVar7 = eglu::selectNativeWindowFactory(factory,pCVar6);
  bVar1 = true;
  window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data._8_8_
       = 0x400003040;
  pvVar5 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&windowFactory);
  config_00 = eglu::chooseSingleConfig
                        (egl_00,pvVar5,
                         (EGLint *)
                         &window.
                          super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                          .m_data.field_0x8);
  pNVar4 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar5 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&windowFactory);
  pCVar6 = tcu::TestContext::getCommandLine
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  visibility_ = eglu::parseWindowVisibility(pCVar6);
  eglu::WindowParams::WindowParams
            ((WindowParams *)((long)&surface.m_surface + 4),0x1e0,0x1e0,visibility_);
  iVar3 = (*(pNVar7->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar7,pNVar4,pvVar5,config_00,0,(undefined1 *)((long)&surface.m_surface + 4));
  de::DefaultDeleter<eglu::NativeWindow>::DefaultDeleter
            ((DefaultDeleter<eglu::NativeWindow> *)((long)&surface.m_surface + 3));
  de::details::UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::UniquePtr
            ((UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)local_98,
             iVar3);
  pvVar5 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&windowFactory);
  pNVar4 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  window_00 = de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
              operator*((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)
                        local_98);
  display_00 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&windowFactory);
  pvVar8 = eglu::createWindowSurface(pNVar4,window_00,display_00,config_00,(EGLAttrib *)0x0);
  eglu::UniqueSurface::UniqueSurface((UniqueSurface *)local_c0,egl_00,pvVar5,pvVar8);
  tcu::TestLog::operator<<(&local_240,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<
                     (&local_240,(char (*) [50])"Create context A (share_context = EGL_NO_CONTEXT)")
  ;
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_240);
  pvVar5 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&windowFactory);
  share = createContext(this,pvVar5,(EGLContext)0x0,config_00);
  tcu::TestLog::operator<<(&local_3c0,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<
                     (&local_3c0,(char (*) [45])"Create context B (share_context = context A)");
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3c0);
  pvVar5 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&windowFactory);
  context = createContext(this,pvVar5,share,config_00);
  if (((this->m_spec).useResource & 1U) != 0) {
    tcu::TestLog::operator<<(&local_540,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_540,(char (*) [23])"Make current context A");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_540);
    pvVar5 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&windowFactory);
    pvVar8 = eglu::UniqueSurface::operator*((UniqueSurface *)local_c0);
    makeCurrent(this,pvVar5,share,pvVar8);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&height,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&height,(char (*) [18])"Creating resource");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&height);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
    if (((this->m_spec).renderOnContexA & 1U) != 0) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)&screen.m_pixels.m_cap,this->m_log,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&screen.m_pixels.m_cap,(char (*) [16])"Render resource")
      ;
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&screen.m_pixels.m_cap);
      if (((this->m_spec).verifyOnContexA & 1U) == 0) {
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(this,0);
      }
      else {
        tcu::Surface::Surface((Surface *)&ref.m_pixels.m_cap,0xf0,0xf0);
        tcu::Surface::Surface((Surface *)local_878,0xf0,0xf0);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
                  (this,&ref.m_pixels.m_cap,local_878);
        bVar1 = tcu::fuzzyCompare((TestLog *)display.m_display,"Rendered image",
                                  "Rendering result comparision",(Surface *)local_878,
                                  (Surface *)&ref.m_pixels.m_cap,0.05,COMPARE_LOG_RESULT);
        tcu::Surface::~Surface((Surface *)local_878);
        tcu::Surface::~Surface((Surface *)&ref.m_pixels.m_cap);
      }
    }
    if (((this->m_spec).renderOnContexB & 1U) != 0) {
      tcu::TestLog::operator<<(&local_9f8,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<(&local_9f8,(char (*) [23])"Make current context B");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_9f8);
      pvVar5 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&windowFactory);
      pvVar8 = eglu::UniqueSurface::operator*((UniqueSurface *)local_c0);
      makeCurrent(this,pvVar5,context,pvVar8);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&screen_1.m_pixels.m_cap,this->m_log,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&screen_1.m_pixels.m_cap,
                          (char (*) [16])"Render resource");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&screen_1.m_pixels.m_cap);
      if (((this->m_spec).verifyOnContexB & 1U) == 0) {
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(this,0);
      }
      else {
        tcu::Surface::Surface((Surface *)&ref_1.m_pixels.m_cap,0xf0,0xf0);
        tcu::Surface::Surface((Surface *)local_ba8,0xf0,0xf0);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
                  (this,&ref_1.m_pixels.m_cap,local_ba8);
        bVar2 = tcu::fuzzyCompare((TestLog *)display.m_display,"Rendered image",
                                  "Rendering result comparision",(Surface *)local_ba8,
                                  (Surface *)&ref_1.m_pixels.m_cap,0.05,COMPARE_LOG_RESULT);
        if (!bVar2) {
          bVar1 = false;
        }
        tcu::Surface::~Surface((Surface *)local_ba8);
        tcu::Surface::~Surface((Surface *)&ref_1.m_pixels.m_cap);
      }
    }
    if (((this->m_spec).destroyOnContexB & 1U) == 0) {
      tcu::TestLog::operator<<(&local_1028,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<(&local_1028,(char (*) [23])"Make current context A");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1028);
      pvVar5 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&windowFactory);
      pvVar8 = eglu::UniqueSurface::operator*((UniqueSurface *)local_c0);
      makeCurrent(this,pvVar5,share,pvVar8);
      tcu::TestLog::operator<<(&local_11a8,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<(&local_11a8,(char (*) [17])"Destroy resource");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_11a8);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])();
    }
    else {
      tcu::TestLog::operator<<(&local_d28,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<(&local_d28,(char (*) [23])"Make current context B");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_d28);
      pvVar5 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&windowFactory);
      pvVar8 = eglu::UniqueSurface::operator*((UniqueSurface *)local_c0);
      makeCurrent(this,pvVar5,context,pvVar8);
      tcu::TestLog::operator<<(&local_ea8,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<(&local_ea8,(char (*) [17])"Destroy resource");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_ea8);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])();
    }
  }
  pvVar5 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&windowFactory);
  makeCurrent(this,pvVar5,(EGLContext)0x0,(EGLSurface)0x0);
  if (((this->m_spec).destroyContextBFirst & 1U) == 0) {
    tcu::TestLog::operator<<(&local_1628,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_1628,(char (*) [18])"Destroy context A");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1628);
    pvVar5 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&windowFactory);
    (*egl_00->_vptr_Library[0x13])(egl_00,pvVar5,share);
    tcu::TestLog::operator<<(&local_17a8,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_17a8,(char (*) [18])"Destroy context B");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_17a8);
    pvVar5 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&windowFactory);
    (*egl_00->_vptr_Library[0x13])(egl_00,pvVar5,context);
  }
  else {
    tcu::TestLog::operator<<(&local_1328,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_1328,(char (*) [18])"Destroy context B");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1328);
    pvVar5 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&windowFactory);
    (*egl_00->_vptr_Library[0x13])(egl_00,pvVar5,context);
    tcu::TestLog::operator<<(&local_14a8,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_14a8,(char (*) [18])"Destroy context A");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_14a8);
    pvVar5 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&windowFactory);
    (*egl_00->_vptr_Library[0x13])(egl_00,pvVar5,share);
  }
  err = (*egl_00->_vptr_Library[0x1f])();
  eglu::checkError(err,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                   ,0x112);
  eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)local_c0);
  de::details::UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::~UniquePtr
            ((UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)local_98);
  if (bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  eglu::UniqueDisplay::~UniqueDisplay((UniqueDisplay *)&windowFactory);
  return STOP;
}

Assistant:

TestCase::IterateResult GLES2SharingTest::iterate (void)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	tcu::TestLog&						log				= m_testCtx.getLog();
	eglu::UniqueDisplay					display			(egl, eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay()));
	const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());
	EGLConfig							config;
	bool								isOk			= true;
	EGLContext							contextA		= EGL_NO_CONTEXT;
	EGLContext							contextB		= EGL_NO_CONTEXT;

	{
		const EGLint attribList[] =
		{
			EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
			EGL_SURFACE_TYPE,		EGL_WINDOW_BIT,
			EGL_ALPHA_SIZE,			1,
			EGL_NONE
		};

		config = eglu::chooseSingleConfig(egl, *display, attribList);
	}

	try
	{
		de::UniquePtr<eglu::NativeWindow>	window	(windowFactory.createWindow(&m_eglTestCtx.getNativeDisplay(), *display, config, DE_NULL, eglu::WindowParams(480, 480, eglu::parseWindowVisibility(m_testCtx.getCommandLine()))));
		eglu::UniqueSurface					surface	(egl, *display, eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *window, *display, config, DE_NULL));

		m_log << tcu::TestLog::Message << "Create context A (share_context = EGL_NO_CONTEXT)" << tcu::TestLog::EndMessage;
		contextA = createContext(*display, EGL_NO_CONTEXT, config);

		m_log << tcu::TestLog::Message << "Create context B (share_context = context A)" << tcu::TestLog::EndMessage;
		contextB = createContext(*display, contextA, config);

		if (m_spec.useResource)
		{
			m_log << tcu::TestLog::Message << "Make current context A" << tcu::TestLog::EndMessage;
			makeCurrent(*display, contextA, *surface);
			m_log << tcu::TestLog::Message << "Creating resource" << tcu::TestLog::EndMessage;
			createResource();

			int		width	= 240;
			int		height	= 240;

			if (m_spec.renderOnContexA)
			{
				m_log << tcu::TestLog::Message << "Render resource" << tcu::TestLog::EndMessage;
				if (m_spec.verifyOnContexA)
				{
					tcu::Surface screen	(width, height);
					tcu::Surface ref	(width, height);
					renderResource(&screen, &ref);

					if (!fuzzyCompare(log, "Rendered image", "Rendering result comparision", ref, screen, 0.05f, tcu::COMPARE_LOG_RESULT))
						isOk = false;
				}
				else
				{
					renderResource(DE_NULL, DE_NULL);
				}
			}

			if (m_spec.renderOnContexB)
			{
				m_log << tcu::TestLog::Message << "Make current context B" << tcu::TestLog::EndMessage;
				makeCurrent(*display, contextB, *surface);
				m_log << tcu::TestLog::Message << "Render resource" << tcu::TestLog::EndMessage;
				if (m_spec.verifyOnContexB)
				{
					tcu::Surface screen	(width, height);
					tcu::Surface ref	(width, height);
					renderResource(&screen, &ref);

					if (!fuzzyCompare(log, "Rendered image", "Rendering result comparision", ref, screen, 0.05f, tcu::COMPARE_LOG_RESULT))
						isOk = false;
				}
				else
				{
					renderResource(DE_NULL, DE_NULL);
				}
			}

			if (m_spec.destroyOnContexB)
			{
				m_log << tcu::TestLog::Message << "Make current context B" << tcu::TestLog::EndMessage;
				makeCurrent(*display, contextB, *surface);
				m_log << tcu::TestLog::Message << "Destroy resource" << tcu::TestLog::EndMessage;
				destroyResource();
			}
			else
			{
				m_log << tcu::TestLog::Message << "Make current context A" << tcu::TestLog::EndMessage;
				makeCurrent(*display, contextA, *surface);
				m_log << tcu::TestLog::Message << "Destroy resource" << tcu::TestLog::EndMessage;
				destroyResource();
			}
		}

		makeCurrent(*display, EGL_NO_CONTEXT, EGL_NO_SURFACE);

		if (m_spec.destroyContextBFirst)
		{
			m_log << tcu::TestLog::Message << "Destroy context B" << tcu::TestLog::EndMessage;
			egl.destroyContext(*display, contextB);
			contextB = EGL_NO_CONTEXT;

			m_log << tcu::TestLog::Message << "Destroy context A" << tcu::TestLog::EndMessage;
			egl.destroyContext(*display, contextA);
			contextA = EGL_NO_CONTEXT;
		}
		else
		{
			m_log << tcu::TestLog::Message << "Destroy context A" << tcu::TestLog::EndMessage;
			egl.destroyContext(*display, contextA);
			contextA = EGL_NO_CONTEXT;

			m_log << tcu::TestLog::Message << "Destroy context B" << tcu::TestLog::EndMessage;
			egl.destroyContext(*display, contextB);
			contextB = EGL_NO_CONTEXT;
		}

		EGLU_CHECK(egl);
	}
	catch (...)
	{
		egl.makeCurrent(*display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);
		if (contextA != EGL_NO_CONTEXT)
			egl.destroyContext(*display, contextA);
		if (contextB != EGL_NO_CONTEXT)
			egl.destroyContext(*display, contextB);
		throw;
	}

	if (isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	return STOP;
}